

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.cpp
# Opt level: O2

void __thiscall
btBox2dShape::getAabb(btBox2dShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btScalar margin;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  btTransformAabb(&(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                   m_implicitShapeDimensions,margin,t,aabbMin,aabbMax);
  return;
}

Assistant:

void btBox2dShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	btTransformAabb(getHalfExtentsWithoutMargin(),getMargin(),t,aabbMin,aabbMax);
}